

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::changeElement(SPxLPBase<double> *this,int i,int j,double *val,bool scale)

{
  uint uVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Nonzero<double> *pNVar2;
  Nonzero<double> *pNVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  Item *pIVar11;
  Item *pIVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar14;
  Real RVar15;
  uint local_60;
  uint local_5c;
  double local_58;
  ulong uStack_50;
  Real local_40;
  double local_38;
  
  if ((j | i) < 0) {
    return;
  }
  pIVar12 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
            (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  pIVar11 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
            (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[j].idx;
  local_58 = *val;
  uStack_50 = 0;
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_60 = j;
  local_5c = i;
  RVar15 = Tolerances::epsilon(this_00);
  local_58 = ABS(local_58);
  uStack_50 = uStack_50 & 0x7fffffffffffffff;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_40 = RVar15;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    RVar15 = local_40;
  }
  uVar1 = local_60;
  if (local_58 <= RVar15) {
    pNVar2 = (pIVar12->data).super_SVectorBase<double>.m_elem;
    if (pNVar2 == (Nonzero<double> *)0x0) {
      return;
    }
    iVar6 = (pIVar12->data).super_SVectorBase<double>.memused;
    lVar7 = (long)iVar6;
    if (lVar7 < 1) {
      return;
    }
    lVar5 = 0;
    while (*(uint *)((long)&pNVar2->idx + lVar5) != local_60) {
      lVar5 = lVar5 + 0x10;
      if (lVar7 << 4 == lVar5) {
        return;
      }
    }
    pNVar3 = (pIVar11->data).super_SVectorBase<double>.m_elem;
    if (pNVar3 == (Nonzero<double> *)0x0) {
      return;
    }
    lVar5 = (long)(pIVar11->data).super_SVectorBase<double>.memused;
    if (lVar5 < 1) {
      return;
    }
    lVar10 = 0;
    while (*(uint *)((long)&pNVar3->idx + lVar10) != local_5c) {
      lVar10 = lVar10 + 0x10;
      if (lVar5 * 0x10 == lVar10) {
        return;
      }
    }
    piVar9 = &pNVar2->idx;
    lVar5 = 0;
    do {
      if (*piVar9 == local_60) goto LAB_001c6c04;
      lVar5 = lVar5 + 1;
      piVar9 = piVar9 + 4;
    } while (lVar7 != lVar5);
    lVar5 = 0xffffffff;
LAB_001c6c04:
    iVar6 = iVar6 + -1;
    (pIVar12->data).super_SVectorBase<double>.memused = iVar6;
    iVar4 = (int)lVar5;
    if (iVar4 < iVar6) {
      pNVar2[iVar4].idx = pNVar2[iVar6].idx;
      pNVar2[iVar4].val = pNVar2[iVar6].val;
      pNVar3 = (pIVar11->data).super_SVectorBase<double>.m_elem;
    }
    uVar1 = (pIVar11->data).super_SVectorBase<double>.memused;
    iVar6 = -1;
    if (0 < (int)uVar1 && pNVar3 != (Nonzero<double> *)0x0) {
      piVar9 = &pNVar3->idx;
      uVar8 = 0;
      do {
        if (*piVar9 == local_5c) {
          iVar6 = (int)uVar8;
          break;
        }
        uVar8 = uVar8 + 1;
        piVar9 = piVar9 + 4;
      } while (uVar1 != uVar8);
    }
    iVar4 = uVar1 - 1;
    (pIVar11->data).super_SVectorBase<double>.memused = iVar4;
    if (iVar4 <= iVar6) {
      return;
    }
    pNVar3[iVar6].idx = pNVar3[iVar4].idx;
    pNVar3[iVar6].val = pNVar3[iVar4].val;
    return;
  }
  if (scale) {
    (*this->lp_scaler->_vptr_SPxScaler[0x2a])
              (SUB84(*val,0),this->lp_scaler,this,(ulong)local_5c,(ulong)local_60);
    uVar13 = extraout_XMM0_Da;
    uVar14 = extraout_XMM0_Db;
  }
  else {
    uVar13 = SUB84(*val,0);
    uVar14 = (undefined4)((ulong)*val >> 0x20);
  }
  local_38 = (double)CONCAT44(uVar14,uVar13);
  pNVar2 = (pIVar12->data).super_SVectorBase<double>.m_elem;
  if ((pNVar2 != (Nonzero<double> *)0x0) &&
     (lVar7 = (long)(pIVar12->data).super_SVectorBase<double>.memused, 0 < lVar7)) {
    lVar5 = 0;
    do {
      if (*(uint *)((long)&pNVar2->idx + lVar5) == uVar1) {
        pNVar3 = (pIVar11->data).super_SVectorBase<double>.m_elem;
        if ((pNVar3 != (Nonzero<double> *)0x0) &&
           (lVar5 = (long)(pIVar11->data).super_SVectorBase<double>.memused, 0 < lVar5)) {
          lVar10 = 0;
          goto LAB_001c6b54;
        }
        break;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar7 << 4 != lVar5);
  }
  goto LAB_001c6b68;
  while( true ) {
    lVar10 = lVar10 + 1;
    piVar9 = piVar9 + 4;
    if (lVar7 == lVar10) break;
LAB_001c6c73:
    if (*piVar9 == uVar1) goto LAB_001c6c8b;
  }
  lVar10 = -1;
LAB_001c6c8b:
  pNVar2[lVar10].val = (double)CONCAT44(uVar14,uVar13);
  piVar9 = &pNVar3->idx;
  lVar7 = 0;
  do {
    if (*piVar9 == local_5c) {
      lVar7 = lVar7 >> 0x20;
      goto LAB_001c6cc2;
    }
    lVar7 = lVar7 + 0x100000000;
    piVar9 = piVar9 + 4;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar7 = -1;
LAB_001c6cc2:
  pNVar3[lVar7].val = (double)CONCAT44(uVar14,uVar13);
  return;
  while (lVar10 = lVar10 + 0x10, lVar5 << 4 != lVar10) {
LAB_001c6b54:
    if (*(uint *)((long)&pNVar3->idx + lVar10) == local_5c) {
      piVar9 = &pNVar2->idx;
      lVar10 = 0;
      goto LAB_001c6c73;
    }
  }
LAB_001c6b68:
  SVSetBase<double>::add2
            ((SVSetBase<double> *)this,
             (SVectorBase<double> *)
             ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[(int)local_5c].
             idx),1,(int *)&local_60,&local_38);
  SVSetBase<double>::add2
            (&(this->super_LPColSetBase<double>).super_SVSetBase<double>,
             (SVectorBase<double> *)
             ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
             (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[(int)local_60].
             idx),1,(int *)&local_5c,&local_38);
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }